

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

matrix4d * tinyusdz::inverse(matrix4d *__return_storage_ptr__,matrix4d *_m)

{
  long lVar1;
  mat<double,_4,_4> *in_RDX;
  mat<double,_4,_4> *pmVar2;
  linalg *plVar3;
  matrix4d *pmVar4;
  byte bVar5;
  matrix44d inv_m;
  mat<double,_4,_4> local_110;
  linalg local_90 [128];
  
  bVar5 = 0;
  plVar3 = local_90;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(double *)plVar3 = *(double *)_m;
    _m = (matrix4d *)((long)_m + 8);
    plVar3 = plVar3 + 8;
  }
  linalg::inverse<double,4>(&local_110,local_90,in_RDX);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  pmVar2 = &local_110;
  pmVar4 = __return_storage_ptr__;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar4->m[0][0] = (pmVar2->x).x;
    pmVar2 = (mat<double,_4,_4> *)((long)pmVar2 + (ulong)bVar5 * -0x10 + 8);
    pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse(const value::matrix4d &_m) {
  matrix44d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 4 * 4);

  matrix44d inv_m = linalg::inverse(m);

  value::matrix4d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 4 * 4);

  return outm;
}